

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

CompositeISE *
Saturation::SaturationAlgorithm::createISE
          (Problem *prb,Options *opt,Ordering *ordering,bool alascaTakesOver)

{
  bool bVar1;
  byte bVar2;
  Condensation CVar3;
  CNFOnTheFly CVar4;
  ArithmeticSimplificationMode AVar5;
  EvaluationMode EVar6;
  QuestionAnsweringMode QVar7;
  CompositeISE *pCVar8;
  undefined8 *puVar9;
  SimplifyingGeneratingInference1 *pSVar10;
  CompositeISE *this;
  byte in_CL;
  Options *in_RSI;
  SimplifyingGeneratingInference1 *gen;
  SimplifyingGeneratingInference1 **__end3;
  SimplifyingGeneratingInference1 **__begin3;
  Stack<Inferences::SimplifyingGeneratingInference1_*> *__range3;
  bool mayHaveEquality;
  CompositeISE *res;
  Options *in_stack_fffffffffffffd38;
  Problem *in_stack_fffffffffffffd40;
  EquationalTautologyRemoval *in_stack_fffffffffffffd50;
  Ordering *in_stack_fffffffffffffd60;
  Ordering *in_stack_fffffffffffffd68;
  undefined1 doNormalize;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  string *in_stack_fffffffffffffe88;
  CompositeISE *in_stack_fffffffffffffe90;
  string local_b8 [32];
  string local_98 [32];
  SimplifyingGeneratingInference1 *local_78;
  SimplifyingGeneratingInference1 **local_70;
  SimplifyingGeneratingInference1 **local_68;
  Stack<Inferences::SimplifyingGeneratingInference1_*> local_60;
  Stack<Inferences::SimplifyingGeneratingInference1_*> *local_40;
  byte local_35;
  CompositeISE *local_28;
  byte local_19;
  Options *local_10;
  
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  pCVar8 = (CompositeISE *)::operator_new(0x20);
  Inferences::CompositeISE::CompositeISE((CompositeISE *)in_stack_fffffffffffffd40);
  local_28 = pCVar8;
  local_35 = couldEqualityArise(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  if (((bool)local_35) && (bVar1 = Shell::Options::equationalTautologyRemoval(local_10), bVar1)) {
    ::operator_new(400);
    Inferences::EquationalTautologyRemoval::EquationalTautologyRemoval(in_stack_fffffffffffffd50);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  CVar3 = Shell::Options::condensation(local_10);
  if (CVar3 == FAST) {
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::FastCondensation::FastCondensation((FastCondensation *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  else if ((CVar3 != OFF) && (CVar3 == ON)) {
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::Condensation::Condensation((Condensation *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  bVar1 = Shell::Options::combinatorySup(Lib::env);
  if (bVar1) {
    ::operator_new(0x10);
    Inferences::CombinatorDemodISE::CombinatorDemodISE
              ((CombinatorDemodISE *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
    ::operator_new(0x10);
    Inferences::CombinatorNormalisationISE::CombinatorNormalisationISE
              ((CombinatorNormalisationISE *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  bVar1 = Shell::Options::choiceReasoning(Lib::env);
  if (bVar1) {
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::ChoiceDefinitionISE::ChoiceDefinitionISE
              ((ChoiceDefinitionISE *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  bVar1 = Kernel::Problem::hasLogicalProxy(in_stack_fffffffffffffd40);
  if ((((bVar1) || (bVar1 = Kernel::Problem::hasBoolVar(in_stack_fffffffffffffd40), bVar1)) ||
      (bVar1 = Kernel::Problem::hasFOOL(in_stack_fffffffffffffd40), bVar1)) &&
     ((bVar1 = Kernel::Problem::isHigherOrder(in_stack_fffffffffffffd40), bVar1 &&
      (bVar1 = Shell::Options::addProxyAxioms(Lib::env), !bVar1)))) {
    CVar4 = Shell::Options::cnfOnTheFly(Lib::env);
    if (CVar4 == EAGER) {
      puVar9 = (undefined8 *)::operator_new(0x10);
      *puVar9 = 0;
      puVar9[1] = 0;
      Inferences::EagerClausificationISE::EagerClausificationISE
                ((EagerClausificationISE *)in_stack_fffffffffffffd40);
      Inferences::CompositeISE::addFrontMany
                ((CompositeISE *)in_stack_fffffffffffffd40,
                 (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
    }
    else {
      puVar9 = (undefined8 *)::operator_new(0x10);
      *puVar9 = 0;
      puVar9[1] = 0;
      Inferences::IFFXORRewriterISE::IFFXORRewriterISE
                ((IFFXORRewriterISE *)in_stack_fffffffffffffd40);
      Inferences::CompositeISE::addFront
                ((CompositeISE *)in_stack_fffffffffffffd40,
                 (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
    }
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::BoolSimp::BoolSimp((BoolSimp *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  bVar1 = Kernel::Problem::hasFOOL(in_stack_fffffffffffffd40);
  if (((bVar1) && (bVar1 = Shell::Options::casesSimp(local_10), bVar1)) &&
     (bVar1 = Shell::Options::cases(local_10), !bVar1)) {
    in_stack_fffffffffffffe90 = local_28;
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::CasesSimp::CasesSimp((CasesSimp *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFrontMany
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  if (((local_35 & 1) != 0) && (bVar1 = Kernel::Signature::hasDistinctGroups(DAT_01333830), bVar1))
  {
    in_stack_fffffffffffffe88 = (string *)::operator_new(0x10);
    *(undefined8 *)in_stack_fffffffffffffe88 = 0;
    in_stack_fffffffffffffe88->_M_string_length = 0;
    Inferences::DistinctEqualitySimplifier::DistinctEqualitySimplifier
              ((DistinctEqualitySimplifier *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  if ((((local_35 & 1) != 0) &&
      (bVar1 = Kernel::Signature::hasTermAlgebras((Signature *)0xad6410), bVar1)) &&
     (bVar1 = Shell::Options::termAlgebraInferences(local_10), bVar1)) {
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::DistinctnessISE::DistinctnessISE((DistinctnessISE *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::InjectivityISE::InjectivityISE((InjectivityISE *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::NegativeInjectivityISE::NegativeInjectivityISE
              ((NegativeInjectivityISE *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  bVar1 = Kernel::Problem::hasInterpretedOperations(in_stack_fffffffffffffd40);
  if ((bVar1) || (bVar1 = Kernel::Problem::hasNumerals(in_stack_fffffffffffffd40), bVar1)) {
    AVar5 = Shell::Options::arithmeticSubtermGeneralizations(Lib::env);
    if (AVar5 == FORCE) {
      Inferences::allArithmeticSubtermGeneralizations();
      local_40 = &local_60;
      local_68 = Lib::Stack<Inferences::SimplifyingGeneratingInference1_*>::begin(&local_60);
      local_70 = Lib::Stack<Inferences::SimplifyingGeneratingInference1_*>::end(local_40);
      for (; local_68 != local_70; local_68 = local_68 + 1) {
        local_78 = *local_68;
        Inferences::SimplifyingGeneratingInference1::asISE(local_78);
        Inferences::CompositeISE::addFront
                  ((CompositeISE *)in_stack_fffffffffffffd40,
                   (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
      }
      Lib::Stack<Inferences::SimplifyingGeneratingInference1_*>::~Stack
                ((Stack<Inferences::SimplifyingGeneratingInference1_*> *)in_stack_fffffffffffffd40);
    }
    AVar5 = Shell::Options::gaussianVariableElimination(Lib::env);
    if (AVar5 == FORCE) {
      pSVar10 = (SimplifyingGeneratingInference1 *)::operator_new(0x20);
      (pSVar10->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
           (_func_int **)0x0;
      (pSVar10->super_ImmediateSimplificationEngine).super_InferenceEngine._salg =
           (SaturationAlgorithm *)0x0;
      (pSVar10->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine =
           (_func_int **)0x0;
      (pSVar10->super_SimplifyingGeneratingInference).super_InferenceEngine._salg =
           (SaturationAlgorithm *)0x0;
      Inferences::GaussianVariableElimination::GaussianVariableElimination
                ((GaussianVariableElimination *)in_stack_fffffffffffffd40);
      Inferences::SimplifyingGeneratingInference1::asISE(pSVar10);
      Inferences::CompositeISE::addFront
                ((CompositeISE *)in_stack_fffffffffffffd40,
                 (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
    }
    AVar5 = Shell::Options::cancellation(Lib::env);
    if (AVar5 == FORCE) {
      pSVar10 = (SimplifyingGeneratingInference1 *)::operator_new(0x30);
      Inferences::Cancellation::Cancellation
                ((Cancellation *)in_stack_fffffffffffffd40,(Ordering *)in_stack_fffffffffffffd38);
      Inferences::SimplifyingGeneratingInference1::asISE(pSVar10);
      Inferences::CompositeISE::addFront
                ((CompositeISE *)in_stack_fffffffffffffd40,
                 (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
    }
    if ((local_19 & 1) == 0) {
      EVar6 = Shell::Options::evaluationMode(Lib::env);
      switch(EVar6) {
      case OFF:
        break;
      case SIMPLE:
        ::operator_new(0x18);
        doNormalize = (undefined1)((ulong)in_stack_fffffffffffffd68 >> 0x38);
        Shell::Options::inequalityNormalization(Lib::env);
        Inferences::InterpretedEvaluation::InterpretedEvaluation
                  ((InterpretedEvaluation *)
                   CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),(bool)doNormalize,
                   in_stack_fffffffffffffd60);
        Inferences::CompositeISE::addFront
                  ((CompositeISE *)in_stack_fffffffffffffd40,
                   (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
        break;
      case POLYNOMIAL_FORCE:
        pSVar10 = (SimplifyingGeneratingInference1 *)::operator_new(0x58);
        Inferences::PolynomialEvaluationRule::PolynomialEvaluationRule
                  ((PolynomialEvaluationRule *)
                   CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                   in_stack_fffffffffffffd68);
        Inferences::SimplifyingGeneratingInference1::asISE(pSVar10);
        Inferences::CompositeISE::addFront
                  ((CompositeISE *)in_stack_fffffffffffffd40,
                   (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
        break;
      case POLYNOMIAL_CAUTIOUS:
      }
    }
    bVar1 = Shell::Options::pushUnaryMinus(Lib::env);
    if (bVar1) {
      puVar9 = (undefined8 *)::operator_new(0x10);
      *puVar9 = 0;
      puVar9[1] = 0;
      Inferences::PushUnaryMinus::PushUnaryMinus((PushUnaryMinus *)in_stack_fffffffffffffd40);
      Inferences::CompositeISE::addFront
                ((CompositeISE *)in_stack_fffffffffffffd40,
                 (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
    }
  }
  if ((local_35 & 1) != 0) {
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::TrivialInequalitiesRemovalISE::TrivialInequalitiesRemovalISE
              ((TrivialInequalitiesRemovalISE *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  ::operator_new(0x18);
  Inferences::TautologyDeletionISE::TautologyDeletionISE
            ((TautologyDeletionISE *)in_stack_fffffffffffffd40,
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  Inferences::CompositeISE::addFront
            ((CompositeISE *)in_stack_fffffffffffffd40,
             (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  bVar1 = Shell::Options::newTautologyDel(Lib::env);
  if (bVar1) {
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::TautologyDeletionISE2::TautologyDeletionISE2
              ((TautologyDeletionISE2 *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  }
  puVar9 = (undefined8 *)::operator_new(0x10);
  *puVar9 = 0;
  puVar9[1] = 0;
  Inferences::DuplicateLiteralRemovalISE::DuplicateLiteralRemovalISE
            ((DuplicateLiteralRemovalISE *)in_stack_fffffffffffffd40);
  Inferences::CompositeISE::addFront
            ((CompositeISE *)in_stack_fffffffffffffd40,
             (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
  QVar7 = Shell::Options::questionAnswering(Lib::env);
  if (QVar7 == PLAIN) {
    puVar9 = (undefined8 *)::operator_new(0x10);
    *puVar9 = 0;
    puVar9[1] = 0;
    Inferences::AnswerLiteralResolver::AnswerLiteralResolver
              ((AnswerLiteralResolver *)in_stack_fffffffffffffd40);
    Inferences::CompositeISE::addFront
              ((CompositeISE *)in_stack_fffffffffffffd40,
               (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
    Shell::Options::questionAnsweringAvoidThese_abi_cxx11_(in_stack_fffffffffffffd38);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(local_98);
    if ((bVar2 & 1) != 0) {
      ::operator_new(0x18);
      Shell::Options::questionAnsweringAvoidThese_abi_cxx11_(in_stack_fffffffffffffd38);
      Inferences::UndesiredAnswerLiteralRemoval::UndesiredAnswerLiteralRemoval
                ((UndesiredAnswerLiteralRemoval *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
      Inferences::CompositeISE::addFront
                ((CompositeISE *)in_stack_fffffffffffffd40,
                 (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(local_b8);
    }
  }
  else {
    QVar7 = Shell::Options::questionAnswering(Lib::env);
    if (QVar7 == SYNTHESIS) {
      puVar9 = (undefined8 *)::operator_new(0x10);
      *puVar9 = 0;
      puVar9[1] = 0;
      Inferences::UncomputableAnswerLiteralRemoval::UncomputableAnswerLiteralRemoval
                ((UncomputableAnswerLiteralRemoval *)in_stack_fffffffffffffd40);
      Inferences::CompositeISE::addFront
                ((CompositeISE *)in_stack_fffffffffffffd40,
                 (ImmediateSimplificationEngine *)in_stack_fffffffffffffd38);
      pCVar8 = local_28;
      this = (CompositeISE *)::operator_new(0x10);
      (this->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
           (_func_int **)0x0;
      (this->super_ImmediateSimplificationEngine).super_InferenceEngine._salg =
           (SaturationAlgorithm *)0x0;
      Inferences::MultipleAnswerLiteralRemoval::MultipleAnswerLiteralRemoval
                ((MultipleAnswerLiteralRemoval *)this);
      Inferences::CompositeISE::addFront(this,&pCVar8->super_ImmediateSimplificationEngine);
    }
  }
  return local_28;
}

Assistant:

CompositeISE* SaturationAlgorithm::createISE(Problem& prb, const Options& opt, Ordering& ordering, bool alascaTakesOver)
{
  CompositeISE* res =new CompositeISE();

  bool mayHaveEquality = couldEqualityArise(prb,opt);

  if (mayHaveEquality && opt.equationalTautologyRemoval()) {
    res->addFront(new EquationalTautologyRemoval());
  }

  switch (opt.condensation()) {
    case Options::Condensation::ON:
      res->addFront(new Condensation());
      break;
    case Options::Condensation::FAST:
      res->addFront(new FastCondensation());
      break;
    case Options::Condensation::OFF:
      break;
  }

  if (env.options->combinatorySup()) {
    res->addFront(new CombinatorDemodISE());
    res->addFront(new CombinatorNormalisationISE());
  }

  if (env.options->choiceReasoning()) {
    res->addFront(new ChoiceDefinitionISE());
  }

  if((prb.hasLogicalProxy() || prb.hasBoolVar() || prb.hasFOOL()) &&
      prb.isHigherOrder() && !env.options->addProxyAxioms()){
    if(env.options->cnfOnTheFly() == Options::CNFOnTheFly::EAGER){
      /*res->addFrontMany(new ProxyISE());
      res->addFront(new OrImpAndProxyISE());
      res->addFront(new NotProxyISE());
      res->addFront(new EqualsProxyISE());
      res->addFront(new PiSigmaProxyISE());*/
      res->addFrontMany(new EagerClausificationISE());
    }
    else {
      res->addFront(new IFFXORRewriterISE());
    }
    res->addFront(new BoolSimp());
  }

  if (prb.hasFOOL() && opt.casesSimp() && !opt.cases()) {
    res->addFrontMany(new CasesSimp());
  }

  // Only add if there are distinct groups
  if (mayHaveEquality && env.signature->hasDistinctGroups()) {
    res->addFront(new DistinctEqualitySimplifier());
  }
  if (mayHaveEquality && env.signature->hasTermAlgebras()) {
    if (opt.termAlgebraInferences()) {
      res->addFront(new DistinctnessISE());
      res->addFront(new InjectivityISE());
      res->addFront(new NegativeInjectivityISE());
    }
  }
  if (prb.hasInterpretedOperations() || prb.hasNumerals()) {
    if (env.options->arithmeticSubtermGeneralizations() == Options::ArithmeticSimplificationMode::FORCE) {
      for (auto gen : allArithmeticSubtermGeneralizations()) {
        res->addFront(&gen->asISE());
      }
    }

    if (env.options->gaussianVariableElimination() == Options::ArithmeticSimplificationMode::FORCE) {
      res->addFront(&(new GaussianVariableElimination())->asISE());
    }

    if (env.options->cancellation() == Options::ArithmeticSimplificationMode::FORCE) {
      res->addFront(&(new Cancellation(ordering))->asISE());
    }

    if (alascaTakesOver) {
      // all alasca rules are added later
    } else switch (env.options->evaluationMode()) {
      case Options::EvaluationMode::OFF:
        break;
      case Options::EvaluationMode::SIMPLE:
        res->addFront(new InterpretedEvaluation(env.options->inequalityNormalization(), ordering));
        break;
      case Options::EvaluationMode::POLYNOMIAL_FORCE:
        res->addFront(&(new PolynomialEvaluationRule(ordering))->asISE());
        break;
      case Options::EvaluationMode::POLYNOMIAL_CAUTIOUS:
        break;
    }

    if (env.options->pushUnaryMinus()) {
      res->addFront(new PushUnaryMinus());
    }
  }
  if (mayHaveEquality) {
    res->addFront(new TrivialInequalitiesRemovalISE());
  }
  res->addFront(new TautologyDeletionISE());
  if (env.options->newTautologyDel()) {
    res->addFront(new TautologyDeletionISE2());
  }
  res->addFront(new DuplicateLiteralRemovalISE());

  if (env.options->questionAnswering() == Options::QuestionAnsweringMode::PLAIN) {
    res->addFront(new AnswerLiteralResolver());
    if (env.options->questionAnsweringAvoidThese() != "") {
      res->addFront(new UndesiredAnswerLiteralRemoval(env.options->questionAnsweringAvoidThese()));
    }
  } else if (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS) {
    res->addFront(new UncomputableAnswerLiteralRemoval());
    res->addFront(new MultipleAnswerLiteralRemoval());
  }
  return res;
}